

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O0

void __thiscall
AmstradCPC::ConcreteMachine<true>::ConcreteMachine
          (ConcreteMachine<true> *this,Target *target,ROMFetcher *rom_fetcher)

{
  int iVar1;
  bool bVar2;
  AY38910<true> *this_00;
  undefined4 *puVar3;
  pointer ppVar4;
  uchar *puVar5;
  ulong uVar6;
  uint8_t **local_220;
  uint8_t **local_210;
  uint8_t **local_200;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1e0;
  _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_198;
  _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_190;
  key_type local_184;
  _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_180;
  undefined1 local_178 [8];
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request local_120;
  Request local_f8;
  Request local_d0;
  undefined1 local_a8 [8];
  Request request;
  key_type local_78;
  Name basic;
  Name firmware;
  bool has_amsdos;
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  local_58;
  ROMFetcher *local_20;
  ROMFetcher *rom_fetcher_local;
  Target *target_local;
  ConcreteMachine<true> *this_local;
  
  local_20 = rom_fetcher;
  rom_fetcher_local = (ROMFetcher *)target;
  target_local = (Target *)this;
  MachineTypes::ScanProducer::ScanProducer(&this->super_ScanProducer);
  MachineTypes::AudioProducer::AudioProducer(&this->super_AudioProducer);
  MachineTypes::TimedMachine::TimedMachine(&this->super_TimedMachine);
  MachineTypes::MediaTarget::MediaTarget(&this->super_MediaTarget);
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_58._M_t._M_impl._0_8_ = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::set(&local_58);
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,&local_58);
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~set(&local_58);
  MachineTypes::JoystickMachine::JoystickMachine(&this->super_JoystickMachine);
  Utility::TypeRecipient<AmstradCPC::CharacterMapper>::TypeRecipient<>
            (&this->super_TypeRecipient<AmstradCPC::CharacterMapper>);
  ClockingHint::Observer::Observer(&this->super_Observer);
  Configurable::Device::Device(&this->super_Device);
  AmstradCPC::Machine::Machine(&this->super_Machine);
  Activity::Source::Source(&this->super_Source);
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00c983d8;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00c984a0;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00c984b8;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00c98500;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate = (_func_int **)&DAT_00c98518;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00c98548;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00c98588;
  (this->super_TypeRecipient<AmstradCPC::CharacterMapper>).super_Delegate.super_KeyActions.
  _vptr_KeyActions = (_func_int **)&PTR_set_key_state_00c985a0;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_00c985e0;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00c985f8;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00c98618;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00c98638;
  CPU::Z80::Processor<AmstradCPC::ConcreteMachine<true>,_false,_true>::Processor(&this->z80_,this);
  CRTCBusHandler::CRTCBusHandler(&this->crtc_bus_handler_,this->ram_,&this->interrupt_timer_);
  Motorola::CRTC::
  CRTC6845<AmstradCPC::CRTCBusHandler,_(Motorola::CRTC::Personality)0,_(Motorola::CRTC::CursorType)0>
  ::CRTC6845(&this->crtc_,&this->crtc_bus_handler_);
  AYDeferrer::AYDeferrer(&this->ay_);
  i8255PortHandler::i8255PortHandler
            (&this->i8255_port_handler_,&this->key_state_,&this->crtc_,&this->ay_,
             &this->tape_player_);
  Intel::i8255::i8255<AmstradCPC::i8255PortHandler>::i8255(&this->i8255_,&this->i8255_port_handler_)
  ;
  Cycles::Cycles((Cycles *)&firmware,8000000);
  Amstrad::FDC::FDC(&this->fdc_,(Cycles)_firmware);
  HalfCycles::HalfCycles(&this->time_since_fdc_update_);
  InterruptTimer::InterruptTimer(&this->interrupt_timer_);
  Storage::Tape::BinaryTapePlayer::BinaryTapePlayer(&this->tape_player_,8000000);
  CRC::CCITT::CCITT(&this->tape_crc_);
  this->use_fast_tape_hack_ = false;
  this->allow_fast_tape_hack_ = false;
  HalfCycles::HalfCycles(&this->clock_offset_);
  HalfCycles::HalfCycles(&this->crtc_counter_,4);
  HalfCycles::HalfCycles(&this->half_cycles_since_ay_update_);
  this->fdc_is_sleeping_ = false;
  this->tape_player_is_sleeping_ = false;
  this->has_128k_ = false;
  local_1e0 = this->roms_;
  do {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_1e0);
    local_1e0 = local_1e0 + 1;
  } while (local_1e0 !=
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->upper_rom_is_paged_);
  this->upper_rom_is_paged_ = false;
  local_200 = this->ram_pages_;
  do {
    *local_200 = (uint8_t *)0x0;
    local_200 = local_200 + 1;
  } while (local_200 != this->read_pointers_);
  local_210 = this->read_pointers_;
  do {
    *local_210 = (uint8_t *)0x0;
    local_210 = local_210 + 1;
  } while (local_210 != this->write_pointers_);
  local_220 = this->write_pointers_;
  do {
    *local_220 = (uint8_t *)0x0;
    local_220 = local_220 + 1;
  } while ((KeyboardState *)local_220 != &this->key_state_);
  KeyboardState::KeyboardState(&this->key_state_);
  AmstradCPC::KeyboardMapper::KeyboardMapper(&this->keyboard_mapper_);
  this->has_run_ = false;
  MachineTypes::TimedMachine::set_clock_rate(&this->super_TimedMachine,4000000.0);
  Memory::Fuzz(this->ram_,0x20000);
  ClockingHint::Source::set_clocking_hint_observer((Source *)&this->fdc_,&this->super_Observer);
  ClockingHint::Source::set_clocking_hint_observer
            (&(this->tape_player_).super_TapePlayer.super_Source,&this->super_Observer);
  this_00 = AYDeferrer::ay(&this->ay_);
  GI::AY38910::AY38910SampleSource<true>::set_port_handler
            (&this_00->super_AY38910SampleSource<true>,&(this->key_state_).super_PortHandler);
  basic._3_1_ = None >> 0x18;
  iVar1 = *(int *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 8);
  if (iVar1 == 0) {
    local_78 = CPC464Firmware;
    request.node.children.
    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = CPC464BASIC;
  }
  else if (iVar1 == 1) {
    local_78 = CPC664Firmware;
    request.node.children.
    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = CPC664BASIC;
    basic._3_1_ = 1;
  }
  else {
    local_78 = CPC6128Firmware;
    request.node.children.
    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = CPC6128BASIC;
    basic._3_1_ = 1;
  }
  ROM::Request::Request(&local_d0,local_78,false);
  ROM::Request::Request
            (&local_f8,
             request.node.children.
             super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,false);
  ROM::Request::operator&&((Request *)local_a8,&local_d0,&local_f8);
  ROM::Request::~Request(&local_f8);
  ROM::Request::~Request(&local_d0);
  if ((basic._3_1_ & 1) != None >> 0x18) {
    ROM::Request::Request
              ((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count,AMSDOS,false);
    ROM::Request::operator&&
              (&local_120,(Request *)local_a8,
               (Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ROM::Request::operator=((Request *)local_a8,&local_120);
    ROM::Request::~Request(&local_120);
    ROM::Request::~Request((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)local_178,local_20,(Request *)local_a8);
  bVar2 = ROM::Request::validate((Request *)local_a8,(Map *)local_178);
  if (!bVar2) {
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0;
    __cxa_throw(puVar3,&ROMMachine::Error::typeinfo,0);
  }
  if ((basic._3_1_ & 1) != None >> 0x18) {
    local_184 = AMSDOS;
    local_180._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)local_178,&local_184);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator->(&local_180);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (this->roms_,&ppVar4->second);
  }
  local_190._M_node =
       (_Base_ptr)
       std::
       map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)local_178,&local_78);
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator->(&local_190);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (this->roms_ + 1,&ppVar4->second);
  local_198._M_node =
       (_Base_ptr)
       std::
       map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)local_178,
              (key_type *)
              ((long)&request.node.children.
                      super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator->(&local_198);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (this->roms_ + 2,&ppVar4->second);
  this->upper_rom_is_paged_ = true;
  this->upper_rom_ = BASIC;
  this->write_pointers_[0] = this->ram_;
  this->write_pointers_[1] = this->ram_ + 0x4000;
  this->write_pointers_[2] = this->ram_ + 0x8000;
  this->write_pointers_[3] = this->ram_ + 0xc000;
  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this->roms_ + 1);
  this->read_pointers_[0] = puVar5;
  this->read_pointers_[1] = this->write_pointers_[1];
  this->read_pointers_[2] = this->write_pointers_[2];
  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     (this->roms_ + (int)this->upper_rom_);
  this->read_pointers_[3] = puVar5;
  this->has_128k_ = *(int *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 8) == 2;
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    type_string(this,(string *)&rom_fetcher_local[4].super__Function_base._M_manager);
  }
  insert_media(this,(Media *)&rom_fetcher_local->_M_invoker);
  std::
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~map((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          *)local_178);
  ROM::Request::~Request((Request *)local_a8);
  return;
}

Assistant:

ConcreteMachine(const Analyser::Static::AmstradCPC::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			z80_(*this),
			crtc_bus_handler_(ram_, interrupt_timer_),
			crtc_(crtc_bus_handler_),
			i8255_port_handler_(key_state_, crtc_, ay_, tape_player_),
			i8255_(i8255_port_handler_),
			tape_player_(8000000),
			crtc_counter_(HalfCycles(4))	// This starts the CRTC exactly out of phase with the CPU's memory accesses
		{
			// primary clock is 4Mhz
			set_clock_rate(4000000);

			// ensure memory starts in a random state
			Memory::Fuzz(ram_, sizeof(ram_));

			// register this class as the sleep observer for the FDC and tape
			fdc_.set_clocking_hint_observer(this);
			tape_player_.set_clocking_hint_observer(this);

			// install the keyboard state class as the AY port handler
			ay_.ay().set_port_handler(&key_state_);

			// construct the list of necessary ROMs
			bool has_amsdos = false;
			ROM::Name firmware, basic;

			using Model = Analyser::Static::AmstradCPC::Target::Model;
			switch(target.model) {
				case Model::CPC464:
					firmware = ROM::Name::CPC464Firmware;
					basic = ROM::Name::CPC464BASIC;
				break;
				case Model::CPC664:
					firmware = ROM::Name::CPC664Firmware;
					basic = ROM::Name::CPC664BASIC;
					has_amsdos = true;
				break;
				default:
					firmware = ROM::Name::CPC6128Firmware;
					basic = ROM::Name::CPC6128BASIC;
					has_amsdos = true;
				break;
			}

			ROM::Request request = ROM::Request(firmware) && ROM::Request(basic);
			if(has_amsdos) {
				request = request && ROM::Request(ROM::Name::AMSDOS);
			}

			// Fetch and verify the ROMs.
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			if(has_amsdos) {
				roms_[ROMType::AMSDOS] = roms.find(ROM::Name::AMSDOS)->second;
			}
			roms_[ROMType::OS] = roms.find(firmware)->second;
			roms_[ROMType::BASIC] = roms.find(basic)->second;

			// Establish default memory map
			upper_rom_is_paged_ = true;
			upper_rom_ = ROMType::BASIC;

			write_pointers_[0] = &ram_[0x0000];
			write_pointers_[1] = &ram_[0x4000];
			write_pointers_[2] = &ram_[0x8000];
			write_pointers_[3] = &ram_[0xc000];

			read_pointers_[0] = roms_[ROMType::OS].data();
			read_pointers_[1] = write_pointers_[1];
			read_pointers_[2] = write_pointers_[2];
			read_pointers_[3] = roms_[upper_rom_].data();

			// Set total RAM available.
			has_128k_ = target.model == Model::CPC6128;

			// Type whatever is required.
			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
			}

			insert_media(target.media);
		}